

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O3

int __thiscall TPZMatrix<long>::Decompose_Cholesky(TPZMatrix<long> *this)

{
  undefined1 auVar1 [16];
  char cVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  int extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  long lVar6;
  long lVar7;
  long lVar8;
  double dVar9;
  long tmp;
  long local_50;
  long local_48;
  long local_40;
  long local_38;
  
  cVar2 = (this->super_TPZBaseMatrix).fDecomposed;
  if ((cVar2 != '\0') && (cVar2 != '\x03')) {
    Error("Decompose_Cholesky <Matrix already Decomposed>",(char *)0x0);
    cVar2 = (this->super_TPZBaseMatrix).fDecomposed;
  }
  if (cVar2 == '\0') {
    if ((this->super_TPZBaseMatrix).fRow != (this->super_TPZBaseMatrix).fCol) {
      Error("Decompose_Cholesky <Matrix must be square>",(char *)0x0);
    }
    iVar3 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0xc])(this);
    local_48 = CONCAT44(extraout_var,iVar3);
    if (local_48 != 0 && -1 < extraout_var) {
      lVar8 = 0;
      do {
        if (lVar8 != 0) {
          lVar7 = 0;
          do {
            iVar3 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                              (this,lVar8,lVar7);
            iVar4 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                              (this,lVar8,lVar7);
            iVar5 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                              (this,lVar8,lVar8);
            local_40 = CONCAT44(extraout_var_02,iVar5) -
                       CONCAT44(extraout_var_01,iVar4) * CONCAT44(extraout_var_00,iVar3);
            (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                      (this,lVar8,lVar8,&local_40);
            lVar7 = lVar7 + 1;
          } while (lVar8 != lVar7);
        }
        iVar3 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                          (this,lVar8,lVar8);
        dVar9 = (double)CONCAT44(extraout_var_03,iVar3);
        if (dVar9 < 0.0) {
          dVar9 = sqrt(dVar9);
        }
        else {
          dVar9 = SQRT(dVar9);
        }
        local_40 = (long)dVar9;
        (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                  (this,lVar8,lVar8,&local_40);
        lVar7 = lVar8 + 1;
        local_38 = lVar7;
        if (lVar7 < local_48) {
          do {
            if (lVar8 != 0) {
              lVar6 = 0;
              do {
                iVar3 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                                  (this,lVar8,lVar6);
                iVar4 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                                  (this,lVar7,lVar6);
                iVar5 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                                  (this,lVar8,lVar7);
                local_50 = CONCAT44(extraout_var_06,iVar5) -
                           CONCAT44(extraout_var_05,iVar4) * CONCAT44(extraout_var_04,iVar3);
                (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                          (this,lVar8,lVar7,&local_50);
                lVar6 = lVar6 + 1;
              } while (lVar8 != lVar6);
            }
            iVar3 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                              (this,lVar8,lVar8);
            if (CONCAT44(extraout_var_07,iVar3) == 0) {
              Error("Decompose_Cholesky <Zero on diagonal>",(char *)0x0);
            }
            iVar3 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                              (this,lVar8,lVar7);
            auVar1._4_4_ = extraout_var_08;
            auVar1._0_4_ = iVar3;
            iVar3 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                              (this,lVar8,lVar8);
            auVar1._8_8_ = (long)extraout_var_08 >> 0x1f;
            local_50 = SUB168(auVar1 / SEXT816(CONCAT44(extraout_var_09,iVar3)),0);
            (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                      (this,lVar8,lVar7,&local_50);
            iVar3 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                              (this,lVar8,lVar7);
            local_50 = CONCAT44(extraout_var_10,iVar3);
            (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                      (this,lVar7,lVar8,&local_50);
            lVar7 = lVar7 + 1;
          } while (lVar7 < local_48);
        }
        lVar8 = local_38;
      } while (local_38 != local_48);
    }
    (this->super_TPZBaseMatrix).fDecomposed = '\x03';
  }
  return 3;
}

Assistant:

int TPZMatrix<TVar>::Decompose_Cholesky() {
	if (  fDecomposed && fDecomposed != ECholesky) Error( "Decompose_Cholesky <Matrix already Decomposed>" );
	if (  fDecomposed ) return ECholesky;
	if ( Rows()!=Cols() ) Error( "Decompose_Cholesky <Matrix must be square>" );
	//return 0;
	
	int64_t dim=Dim();
	for (int64_t i=0 ; i<dim; i++) {
		for(int64_t k=0; k<i; k++) {//diagonal elements
            TVar sum = 0;
            if constexpr (is_complex<TVar>::value){
                sum += GetVal(i,k)*std::conj(GetVal(i,k));
            }else{
                sum += GetVal(i,k)*GetVal(i,k);
            }
            PutVal( i,i,GetVal(i,i)-sum );
		}
		TVar tmp = sqrt(GetVal(i,i));
        PutVal( i,i,tmp );
        for (int64_t j=i+1;j<dim; j++) {//off-diagonal elements
            for(int64_t k=0; k<i; k++) {
                TVar sum = 0.;
                if constexpr (is_complex<TVar>::value){
                    sum += GetVal(i,k)*std::conj(GetVal(j,k));
                }else{
                    sum += GetVal(i,k)*GetVal(j,k);
                }
                PutVal( i,j,GetVal(i,j)-sum);
            }
            TVar tmp2 = GetVal(i,i);
            if ( IsZero(tmp2) ) {
				Error( "Decompose_Cholesky <Zero on diagonal>" );
            }
            PutVal(i,j,GetVal(i,j)/GetVal(i,i) );
            if constexpr (is_complex<TVar>::value){
                PutVal(j,i,std::conj(GetVal(i,j)));
            }else{
                PutVal(j,i,GetVal(i,j));
            }
        }
    }
	fDecomposed = ECholesky;
	return ECholesky;
	
}